

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_buffer.c
# Opt level: O3

void test_cio_write_buffer_splice(void)

{
  undefined8 ***pppuVar1;
  undefined8 ***pppuVar2;
  undefined8 ****ppppuVar3;
  uint data1;
  char data2 [13];
  cio_write_buffer wb2_two;
  cio_write_buffer wb2_one;
  undefined8 ***local_108;
  undefined8 ***local_100;
  long local_f8;
  UNITY_INT UStack_f0;
  undefined4 local_e4;
  undefined8 ***local_e0;
  undefined8 ***local_d8;
  long local_d0;
  UNITY_INT UStack_c8;
  undefined5 local_c0;
  undefined3 uStack_bb;
  undefined5 uStack_b8;
  undefined8 ***local_b0;
  undefined8 ***local_a8;
  undefined5 *local_a0;
  undefined8 local_98;
  undefined8 ***local_90;
  undefined8 ***local_88;
  undefined4 *local_80;
  undefined8 local_78;
  undefined8 **local_70;
  undefined8 ***local_68;
  undefined5 *local_60;
  undefined8 local_58;
  undefined8 ***local_50;
  undefined1 *local_48;
  undefined4 *local_40;
  undefined8 local_38;
  
  local_48 = (undefined1 *)&local_108;
  local_70 = &local_108;
  local_e4 = 0x12;
  local_108 = &local_50;
  local_38 = 4;
  uStack_b8 = 0x21646c72;
  local_c0 = 0x6f6c6c6548;
  uStack_bb = 0x6f5720;
  local_100 = &local_70;
  local_58 = 0xd;
  local_f8 = 2;
  UStack_f0 = 0x11;
  local_68 = local_108;
  local_60 = &local_c0;
  local_50 = local_100;
  local_40 = &local_e4;
  UnityAssertEqualNumber
            (2,2,"Number of elements in write buffer not \'2\' after inserting second element!",0xdf
             ,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0x11,UStack_f0,"Write buffer total length not correct!",0xe0,UNITY_DISPLAY_STYLE_INT);
  local_e0 = &local_90;
  local_78 = 4;
  local_d8 = &local_b0;
  local_98 = 0xd;
  local_d0 = 2;
  UStack_c8 = 0x11;
  local_b0 = &local_e0;
  local_a8 = local_e0;
  local_a0 = &local_c0;
  local_90 = local_d8;
  local_88 = &local_e0;
  local_80 = &local_e4;
  UnityAssertEqualNumber
            (2,2,"Number of elements in write buffer not \'2\' after inserting second element!",0xed
             ,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0x11,UStack_c8,"Write buffer total length not correct!",0xee,UNITY_DISPLAY_STYLE_INT);
  if ((undefined8 ****)local_e0 != &local_e0) {
    *local_100 = local_e0;
    local_e0[1] = local_100;
    *local_d8 = &local_108;
    local_100 = local_d8;
    local_f8 = local_f8 + local_d0;
    UStack_f0 = UStack_f0 + UStack_c8;
    local_d0 = 0;
    UStack_c8 = 0;
    local_e0 = &local_e0;
    local_d8 = &local_e0;
  }
  UnityAssertEqualNumber
            (0,local_d0,
             "Number of elements in write buffer two not \'0\' after splicing to another list!",0xf2
             ,UNITY_DISPLAY_STYLE_INT);
  if ((undefined8 ****)local_e0 != &local_e0) {
    UnityFail("Write buffer not empty after splicing!",0xf3);
  }
  UnityAssertEqualNumber
            (4,local_f8,
             "Number of elements in write buffer two not \'4\' after splicing from another list!",
             0xf5,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0x22,UStack_f0,"Write buffer total length not correct!",0xf6,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,UStack_c8,"Write buffer total length not correct!",0xf7,UNITY_DISPLAY_STYLE_INT);
  ppppuVar3 = (undefined8 ****)local_108;
  if ((undefined8 ****)local_108 == &local_108) {
    ppppuVar3 = (undefined8 ****)0x0;
  }
  if (ppppuVar3 != (undefined8 ****)0x0) {
    local_f8 = local_f8 + -1;
    UStack_f0 = UStack_f0 - (long)ppppuVar3[3];
    pppuVar1 = *ppppuVar3;
    pppuVar2 = ppppuVar3[1];
    pppuVar1[1] = pppuVar2;
    *pppuVar2 = pppuVar1;
  }
  UnityAssertEqualNumber
            ((UNITY_INT)&local_50,(UNITY_INT)ppppuVar3,
             "First dequeued write buffer is not correct after splicing!",0xfa,
             UNITY_DISPLAY_STYLE_INT);
  ppppuVar3 = (undefined8 ****)0x0;
  if ((undefined8 ****)local_108 != &local_108) {
    ppppuVar3 = (undefined8 ****)local_108;
  }
  if (ppppuVar3 != (undefined8 ****)0x0) {
    local_f8 = local_f8 + -1;
    UStack_f0 = UStack_f0 - (long)ppppuVar3[3];
    pppuVar1 = *ppppuVar3;
    pppuVar2 = ppppuVar3[1];
    pppuVar1[1] = pppuVar2;
    *pppuVar2 = pppuVar1;
  }
  UnityAssertEqualNumber
            ((UNITY_INT)&local_70,(UNITY_INT)ppppuVar3,
             "Second dequeued write buffer is not correct after splicing!",0xfc,
             UNITY_DISPLAY_STYLE_INT);
  ppppuVar3 = (undefined8 ****)0x0;
  if ((undefined8 ****)local_108 != &local_108) {
    ppppuVar3 = (undefined8 ****)local_108;
  }
  if (ppppuVar3 != (undefined8 ****)0x0) {
    local_f8 = local_f8 + -1;
    UStack_f0 = UStack_f0 - (long)ppppuVar3[3];
    pppuVar1 = *ppppuVar3;
    pppuVar2 = ppppuVar3[1];
    pppuVar1[1] = pppuVar2;
    *pppuVar2 = pppuVar1;
  }
  UnityAssertEqualNumber
            ((UNITY_INT)&local_90,(UNITY_INT)ppppuVar3,
             "Third dequeued write buffer is not correct after splicing!",0xfe,
             UNITY_DISPLAY_STYLE_INT);
  ppppuVar3 = (undefined8 ****)0x0;
  if ((undefined8 ****)local_108 != &local_108) {
    ppppuVar3 = (undefined8 ****)local_108;
  }
  if (ppppuVar3 != (undefined8 ****)0x0) {
    local_f8 = local_f8 + -1;
    UStack_f0 = UStack_f0 - (long)ppppuVar3[3];
    pppuVar1 = *ppppuVar3;
    pppuVar2 = ppppuVar3[1];
    pppuVar1[1] = pppuVar2;
    *pppuVar2 = pppuVar1;
  }
  UnityAssertEqualNumber
            ((UNITY_INT)&local_b0,(UNITY_INT)ppppuVar3,
             "Forth dequeued write buffer is not correct after splicing!",0x100,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_cio_write_buffer_splice(void)
{
	struct cio_write_buffer wbh_one;
	cio_write_buffer_head_init(&wbh_one);

	unsigned int data1 = 0x12;
	struct cio_write_buffer wb1_one;
	cio_write_buffer_element_init(&wb1_one, &data1, sizeof(data1));
	cio_write_buffer_queue_tail(&wbh_one, &wb1_one);

	const char data2[] = "Hello World!";
	struct cio_write_buffer wb2_one;
	cio_write_buffer_const_element_init(&wb2_one, data2, sizeof(data2));
	cio_write_buffer_queue_tail(&wbh_one, &wb2_one);
	size_t num_elements = cio_write_buffer_get_num_buffer_elements(&wbh_one);
	TEST_ASSERT_EQUAL_MESSAGE(2, num_elements, "Number of elements in write buffer not '2' after inserting second element!");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(data1) + sizeof(data2), cio_write_buffer_get_total_size(&wbh_one), "Write buffer total length not correct!");

	struct cio_write_buffer wbh_two;
	cio_write_buffer_head_init(&wbh_two);

	struct cio_write_buffer wb1_two;
	cio_write_buffer_element_init(&wb1_two, &data1, sizeof(data1));
	cio_write_buffer_queue_tail(&wbh_two, &wb1_two);

	struct cio_write_buffer wb2_two;
	cio_write_buffer_const_element_init(&wb2_two, data2, sizeof(data2));
	cio_write_buffer_queue_tail(&wbh_two, &wb2_two);
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh_two);
	TEST_ASSERT_EQUAL_MESSAGE(2, num_elements, "Number of elements in write buffer not '2' after inserting second element!");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(data1) + sizeof(data2), cio_write_buffer_get_total_size(&wbh_two), "Write buffer total length not correct!");

	cio_write_buffer_splice(&wbh_two, &wbh_one);
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh_two);
	TEST_ASSERT_EQUAL_MESSAGE(0, num_elements, "Number of elements in write buffer two not '0' after splicing to another list!");
	TEST_ASSERT_TRUE_MESSAGE(cio_write_buffer_queue_empty(&wbh_two), "Write buffer not empty after splicing!");
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh_one);
	TEST_ASSERT_EQUAL_MESSAGE(4, num_elements, "Number of elements in write buffer two not '4' after splicing from another list!");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(data1) + sizeof(data2) + sizeof(data1) + sizeof(data2), cio_write_buffer_get_total_size(&wbh_one), "Write buffer total length not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(0, cio_write_buffer_get_total_size(&wbh_two), "Write buffer total length not correct!");

	struct cio_write_buffer *dequeued_wb = cio_write_buffer_queue_dequeue(&wbh_one);
	TEST_ASSERT_EQUAL_MESSAGE(&wb1_one, dequeued_wb, "First dequeued write buffer is not correct after splicing!");
	dequeued_wb = cio_write_buffer_queue_dequeue(&wbh_one);
	TEST_ASSERT_EQUAL_MESSAGE(&wb2_one, dequeued_wb, "Second dequeued write buffer is not correct after splicing!");
	dequeued_wb = cio_write_buffer_queue_dequeue(&wbh_one);
	TEST_ASSERT_EQUAL_MESSAGE(&wb1_two, dequeued_wb, "Third dequeued write buffer is not correct after splicing!");
	dequeued_wb = cio_write_buffer_queue_dequeue(&wbh_one);
	TEST_ASSERT_EQUAL_MESSAGE(&wb2_two, dequeued_wb, "Forth dequeued write buffer is not correct after splicing!");
}